

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall
UnitUtilTest_timesOverflowsMid_Test::UnitUtilTest_timesOverflowsMid_Test
          (UnitUtilTest_timesOverflowsMid_Test *this)

{
  UnitUtilTest_timesOverflowsMid_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__UnitUtilTest_timesOverflowsMid_Test_0025d2e8;
  return;
}

Assistant:

TEST(UnitUtilTest, timesOverflowsMid)
{
    const auto m3 = m * m * m;
    const auto m4 = m * m * m * m;
    const auto m5 = m * m * m * m * m;
    const auto im5 = one / m5;
    const auto im4 = one / m4;

    // Start far from bounds:
    EXPECT_FALSE(times_overflows(m3, m4));
    EXPECT_FALSE(times_overflows(m4, m3));

    EXPECT_FALSE(times_overflows(im4, im4));
    if (units::detail::bitwidth::base_size == 4) {
        EXPECT_TRUE(times_overflows(m4, m4));  // overflow
        EXPECT_TRUE(times_overflows(im4, im5));  // underflow
        EXPECT_TRUE(times_overflows(im5, im4));  // underflow
        EXPECT_TRUE(times_overflows(count, count));
    } else {
        EXPECT_FALSE(times_overflows(m4, m4));  // no overflow
        EXPECT_FALSE(times_overflows(im4, im5));  // no underflow
        EXPECT_FALSE(times_overflows(im5, im4));  // no underflow
        EXPECT_FALSE(times_overflows(count, count));
    }
}